

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmMulMont2(word *c,word *a,word *b,qr_o *r,void *stack)

{
  void *pvVar1;
  size_t n;
  void *stack_00;
  ulong uVar2;
  
  pvVar1 = r->params;
  n = r->n;
  stack_00 = (void *)(n * 0x10 + (long)stack);
  zzMul((word *)stack,a,n,b,n,stack_00);
  zzRedMont((word *)stack,r->mod,r->n,*r->params,stack_00);
  wwCopy(c,(word *)stack,r->n);
  for (uVar2 = *(ulong *)((long)pvVar1 + 8); uVar2 < r->n << 6; uVar2 = uVar2 + 1) {
    zzDoubleMod(c,c,r->mod,r->n);
  }
  return;
}

Assistant:

static void zmMulMont2(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	word* prod = (word*)stack;
	// pre
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	// настроить указатели
	params = (const zm_mont_params_st*)r->params;
	stack = prod + 2 * r->n;
	// c <- a b B^{-n} \mod mod
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRedMont(prod, r->mod, r->n, *(word*)r->params, stack);
	wwCopy(c, prod, r->n);
	// c <- c * B^n / 2^l \mod mod
	for (k = params->l; k < B_PER_W * r->n; ++k)
		zzDoubleMod(c, c, r->mod, r->n);
}